

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<8U,_int,_unsigned_int,_int>::insert
          (prevector<8U,_int,_unsigned_int,_int> *this,iterator pos,size_type count,int *value)

{
  void *__src;
  uint uVar1;
  long lVar2;
  uint uVar3;
  prevector<8U,_int,_unsigned_int,_int> *ppVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  prevector<8U,_int,_unsigned_int,_int> *ppVar8;
  int iVar9;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->_size;
  uVar5 = uVar1 - 9;
  ppVar8 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
  uVar7 = uVar5;
  if (uVar1 < 9) {
    uVar7 = uVar1;
  }
  uVar6 = 8;
  if (uVar1 >= 9) {
    uVar6 = (this->_union).indirect_contents.capacity;
  }
  uVar7 = uVar7 + count;
  ppVar4 = ppVar8;
  uVar3 = uVar1;
  if (uVar6 < uVar7) {
    change_capacity(this,(uVar7 >> 1) + uVar7);
    uVar3 = this->_size;
    ppVar4 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
    uVar5 = uVar3 - 9;
  }
  if (uVar1 < 9) {
    ppVar8 = this;
  }
  if (uVar3 < 9) {
    ppVar4 = this;
  }
  iVar9 = (int)((ulong)((long)pos.ptr - (long)ppVar8) >> 2);
  __src = (void *)((long)&ppVar4->_union + (long)iVar9 * 4);
  if (uVar3 < 9) {
    uVar5 = uVar3;
  }
  memmove((void *)((long)__src + (ulong)count * 4),__src,(ulong)(uVar5 - iVar9) << 2);
  uVar5 = count + this->_size;
  this->_size = uVar5;
  if (8 < uVar5) {
    this = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    std::__fill_n_a<int*,long,int>((long)&this->_union + (long)iVar9 * 4,(ulong)count,value);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(iterator pos, size_type count, const T& value) {
        size_type p = pos - begin();
        size_type new_size = size() + count;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        T* ptr = item_ptr(p);
        T* dst = ptr + count;
        memmove(dst, ptr, (size() - p) * sizeof(T));
        _size += count;
        fill(item_ptr(p), count, value);
    }